

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compaction_daemon_test(size_t time_sec)

{
  timeval a;
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  timeval tVar5;
  void *pvVar6;
  fdb_kvs_handle *in_stack_fffffffffffec188;
  fdb_file_handle *in_stack_fffffffffffec190;
  fdb_file_handle *in_stack_fffffffffffec198;
  size_t in_stack_fffffffffffec1b0;
  fdb_file_info *in_stack_fffffffffffec1c0;
  fdb_file_handle *in_stack_fffffffffffec1c8;
  fdb_config *in_stack_fffffffffffec3a8;
  char *in_stack_fffffffffffec3b0;
  fdb_file_handle **in_stack_fffffffffffec3b8;
  fdb_seqnum_t in_stack_fffffffffffec430;
  fdb_kvs_handle **in_stack_fffffffffffec438;
  fdb_kvs_handle *in_stack_fffffffffffec440;
  fdb_config *in_stack_fffffffffffec7e0;
  char *in_stack_fffffffffffec7e8;
  size_t in_stack_fffffffffffece88;
  fdb_compaction_mode_t in_stack_fffffffffffece97;
  fdb_file_handle *in_stack_fffffffffffece98;
  ulong local_588;
  __suseconds_t local_580;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  timeval ts_gap;
  timeval ts_cur;
  timeval ts_begin;
  char *pcStack_128;
  fdb_status status;
  fdb_file_info info;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *db_manual;
  fdb_kvs_handle *db_non;
  fdb_kvs_handle *db_less;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_new;
  fdb_file_handle *dbfile_manual;
  fdb_file_handle *dbfile_non;
  fdb_file_handle *dbfile_less;
  fdb_file_handle *dbfile;
  int escape;
  int compaction_threshold;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  size_t time_sec_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  bVar1 = false;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._2_1_ = 1;
  fconfig.flags._3_1_ = 0x1e;
  fconfig.compaction_minimum_filesize = 1;
  fconfig.max_writer_lock_prob = 0;
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_INVALID_CONFIG) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x63d);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) {
      __assert_fail("status == FDB_RESULT_INVALID_CONFIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x63d,"void compaction_daemon_test(size_t)");
    }
  }
  fconfig.max_writer_lock_prob = 4;
  fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  fdb_kvs_open_default
            (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
             (fdb_kvs_config *)0x10c264);
  fVar2 = fdb_set_log_callback(db_less,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x645);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x645,"void compaction_daemon_test(size_t)");
    }
  }
  printf("Initialize..\n");
  for (n = 0; n < 10000; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%04d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%04d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%04d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar6 = (void *)0x10c3cd;
    sVar4 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffec198,in_stack_fffffffffffec190,
                   (size_t)in_stack_fffffffffffec188,pvVar6,sVar4 + 1,(void *)0x10c408,
                   in_stack_fffffffffffec1b0);
    fdb_set(db_less,*(fdb_doc **)(&stack0xfffffffffffec188 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffec188,'\0');
  fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x658);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x658,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10c4e0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x65a);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x65a,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_set_log_callback(db_less,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x65d);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x65d,"void compaction_daemon_test(size_t)");
    }
  }
  fdb_get_file_info(in_stack_fffffffffffec1c8,in_stack_fffffffffffec1c0);
  iVar3 = strcmp(pcStack_128,"compact_test");
  if (iVar3 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x660);
    compaction_daemon_test::__test_pass = 0;
    iVar3 = strcmp(pcStack_128,"compact_test");
    if (iVar3 != 0) {
      __assert_fail("!strcmp(info.filename, \"compact_test\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x660,"void compaction_daemon_test(size_t)");
    }
  }
  for (n = 0; n < 10000; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%04d",(ulong)(uint)n);
    pvVar6 = (void *)0x10c6ab;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffec198,in_stack_fffffffffffec190,
                   (size_t)in_stack_fffffffffffec188,pvVar6,0,(void *)0x10c6dc,
                   in_stack_fffffffffffec1b0);
    fVar2 = fdb_get(db_less,(fdb_doc *)info.num_live_nodes);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x669);
      compaction_daemon_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x669,"void compaction_daemon_test(size_t)");
      }
    }
    iVar3 = memcmp(*(void **)(info.num_live_nodes + 0x40),
                   *(void **)(*(long *)(&stack0xfffffffffffec188 + (long)n * 8) + 0x40),
                   *(size_t *)(info.num_live_nodes + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffec188 + (long)n * 8) + 0x40),
              *(undefined8 *)(info.num_live_nodes + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x66a);
      compaction_daemon_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x66a,"void compaction_daemon_test(size_t)");
    }
    fdb_doc_free((fdb_doc *)0x10c807);
  }
  fVar2 = fdb_snapshot_open(in_stack_fffffffffffec440,in_stack_fffffffffffec438,
                            in_stack_fffffffffffec430);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x670);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x670,"void compaction_daemon_test(size_t)");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffec188);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
  system("rm -rf  compact_test.meta > errorlog.txt");
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x67d);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x67d,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10c950);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x67f);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x67f,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_set_log_callback(db_less,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x682);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x682,"void compaction_daemon_test(size_t)");
    }
  }
  for (n = 0; n < 10000; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%04d",(ulong)(uint)n);
    pvVar6 = (void *)0x10ca81;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffec198,in_stack_fffffffffffec190,
                   (size_t)in_stack_fffffffffffec188,pvVar6,0,(void *)0x10cab2,
                   in_stack_fffffffffffec1b0);
    fVar2 = fdb_get(db_less,(fdb_doc *)info.num_live_nodes);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x68a);
      compaction_daemon_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x68a,"void compaction_daemon_test(size_t)");
      }
    }
    iVar3 = memcmp(*(void **)(info.num_live_nodes + 0x40),
                   *(void **)(*(long *)(&stack0xfffffffffffec188 + (long)n * 8) + 0x40),
                   *(size_t *)(info.num_live_nodes + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffec188 + (long)n * 8) + 0x40),
              *(undefined8 *)(info.num_live_nodes + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x68b);
      compaction_daemon_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x68b,"void compaction_daemon_test(size_t)");
    }
    fdb_doc_free((fdb_doc *)0x10cbdd);
  }
  fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x697);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x697,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10cc9a);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x699);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x699,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_set_log_callback(db_less,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x69c);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x69c,"void compaction_daemon_test(size_t)");
    }
  }
  for (n = 0; n < 10000; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%04d",(ulong)(uint)n);
    pvVar6 = (void *)0x10cdcb;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffec198,in_stack_fffffffffffec190,
                   (size_t)in_stack_fffffffffffec188,pvVar6,0,(void *)0x10cdfc,
                   in_stack_fffffffffffec1b0);
    fVar2 = fdb_get(db_less,(fdb_doc *)info.num_live_nodes);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x6a4);
      compaction_daemon_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x6a4,"void compaction_daemon_test(size_t)");
      }
    }
    iVar3 = memcmp(*(void **)(info.num_live_nodes + 0x40),
                   *(void **)(*(long *)(&stack0xfffffffffffec188 + (long)n * 8) + 0x40),
                   *(size_t *)(info.num_live_nodes + 0x10));
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffec188 + (long)n * 8) + 0x40),
              *(undefined8 *)(info.num_live_nodes + 0x40),
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x6a5);
      compaction_daemon_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6a5,"void compaction_daemon_test(size_t)");
    }
    fdb_doc_free((fdb_doc *)0x10cf27);
  }
  fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6b3);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6b3,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10cfdb);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6b5);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6b5,"void compaction_daemon_test(size_t)");
    }
  }
  fconfig.flags._3_1_ = 0;
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6b9);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6b9,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10d0e8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6bb);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6bb,"void compaction_daemon_test(size_t)");
    }
  }
  fconfig.flags._2_1_ = 0;
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6bf);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6bf,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10d1f5);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6c1);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6c1,"void compaction_daemon_test(size_t)");
    }
  }
  fconfig.flags._3_1_ = 0x1e;
  fconfig.flags._2_1_ = 1;
  fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6c7);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6c7,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffec190,(fdb_kvs_handle **)in_stack_fffffffffffec188,
                     (fdb_kvs_config *)0x10d303);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6c9);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6c9,"void compaction_daemon_test(size_t)");
    }
  }
  fVar2 = fdb_set_log_callback(db_less,logCallbackFunc,"compaction_daemon_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x6cc);
    compaction_daemon_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x6cc,"void compaction_daemon_test(size_t)");
    }
  }
  printf("wait for %d seconds..\n",time_sec & 0xffffffff);
  gettimeofday((timeval *)&ts_cur.tv_usec,(__timezone_ptr_t)0x0);
  do {
    if (bVar1) {
      fVar2 = fdb_set_daemon_compaction_interval
                        (in_stack_fffffffffffec198,(size_t)in_stack_fffffffffffec190);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x6ef);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x6ef,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_set_daemon_compaction_interval
                        (in_stack_fffffffffffec198,(size_t)in_stack_fffffffffffec190);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x6f2);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x6f2,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_compact(in_stack_fffffffffffec190,(char *)in_stack_fffffffffffec188);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x6f6);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x6f6,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_compact(in_stack_fffffffffffec190,(char *)in_stack_fffffffffffec188);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x6fa);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x6fa,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.flags._2_1_ = 0;
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x6ff);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x6ff,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_switch_compaction_mode
                        (in_stack_fffffffffffece98,in_stack_fffffffffffece97,
                         in_stack_fffffffffffece88);
      if (fVar2 != FDB_RESULT_FILE_IS_BUSY) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x703);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_FILE_IS_BUSY) {
          __assert_fail("status == FDB_RESULT_FILE_IS_BUSY",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x703,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x707);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x707,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_switch_compaction_mode
                        (in_stack_fffffffffffece98,in_stack_fffffffffffece97,
                         in_stack_fffffffffffece88);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x70b);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x70b,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_switch_compaction_mode
                        (in_stack_fffffffffffece98,in_stack_fffffffffffece97,
                         in_stack_fffffffffffece88);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x70f);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x70f,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x713);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x713,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.flags._2_1_ = 1;
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x716);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x716,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_switch_compaction_mode
                        (in_stack_fffffffffffece98,in_stack_fffffffffffece97,
                         in_stack_fffffffffffece88);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x71a);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x71a,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x71e);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x71e,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.flags._2_1_ = 0;
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x721);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x721,"void compaction_daemon_test(size_t)");
        }
      }
      fdb_compact(in_stack_fffffffffffec190,(char *)in_stack_fffffffffffec188);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      fconfig.flags._2_1_ = 1;
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x72e);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
          __assert_fail("status == FDB_RESULT_INVALID_COMPACTION_MODE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x72e,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_destroy(in_stack_fffffffffffec7e8,in_stack_fffffffffffec7e0);
      if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x732);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
          __assert_fail("status == FDB_RESULT_INVALID_COMPACTION_MODE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x732,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.flags._2_1_ = 0;
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x737);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
          __assert_fail("status == FDB_RESULT_INVALID_COMPACTION_MODE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x737,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_destroy(in_stack_fffffffffffec7e8,in_stack_fffffffffffec7e0);
      if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x73b);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) {
          __assert_fail("status == FDB_RESULT_INVALID_COMPACTION_MODE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x73b,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.flags._2_1_ = 1;
      fVar2 = fdb_destroy(in_stack_fffffffffffec7e8,in_stack_fffffffffffec7e0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x740);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x740,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.flags._2_1_ = 0;
      fVar2 = fdb_destroy(in_stack_fffffffffffec7e8,in_stack_fffffffffffec7e0);
      if (fVar2 != FDB_RESULT_FILE_IS_BUSY) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x745);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_FILE_IS_BUSY) {
          __assert_fail("status == FDB_RESULT_FILE_IS_BUSY",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x745,"void compaction_daemon_test(size_t)");
        }
      }
      fdb_close((fdb_file_handle *)in_stack_fffffffffffec188);
      fVar2 = fdb_shutdown();
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x74b);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x74b,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_destroy(in_stack_fffffffffffec7e8,in_stack_fffffffffffec7e0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x74e);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x74e,"void compaction_daemon_test(size_t)");
        }
      }
      fconfig.purging_interval = 2;
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x753);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
          __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x753,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x756);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
          __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x756,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x75a);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
          __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x75a,"void compaction_daemon_test(size_t)");
        }
      }
      fVar2 = fdb_open(in_stack_fffffffffffec3b8,in_stack_fffffffffffec3b0,in_stack_fffffffffffec3a8
                      );
      if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x75e);
        compaction_daemon_test::__test_pass = 0;
        if (fVar2 != FDB_RESULT_NO_SUCH_FILE) {
          __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x75e,"void compaction_daemon_test(size_t)");
        }
      }
      for (n = 0; n < 10000; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x10e2e2);
      }
      fdb_shutdown();
      memleak_end();
      if (compaction_daemon_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","compaction daemon test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","compaction daemon test");
      }
      return;
    }
    for (n = 0; n < 10000; n = n + 1) {
      fdb_set(db_less,*(fdb_doc **)(&stack0xfffffffffffec188 + (long)n * 8));
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffec188,'\0');
      if (n % 100 == 0) {
        fdb_set(db_non,*(fdb_doc **)(&stack0xfffffffffffec188 + (long)n * 8));
        fdb_commit((fdb_file_handle *)in_stack_fffffffffffec188,'\0');
      }
      fdb_set(db_manual,*(fdb_doc **)(&stack0xfffffffffffec188 + (long)n * 8));
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffec188,'\0');
      fdb_set(snapshot,*(fdb_doc **)(&stack0xfffffffffffec188 + (long)n * 8));
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffec188,'\0');
      gettimeofday((timeval *)&ts_gap.tv_usec,(__timezone_ptr_t)0x0);
      a.tv_usec = ts_begin.tv_sec;
      a.tv_sec = ts_cur.tv_usec;
      tVar5.tv_usec = ts_cur.tv_sec;
      tVar5.tv_sec = ts_gap.tv_usec;
      tVar5 = _utime_gap(a,tVar5);
      local_588 = tVar5.tv_sec;
      local_580 = tVar5.tv_usec;
      ts_gap.tv_sec = local_580;
      if (time_sec <= local_588) {
        bVar1 = true;
        break;
      }
    }
  } while( true );
}

Assistant:

void compaction_daemon_test(size_t time_sec)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10000;
    int compaction_threshold = 30;
    int escape = 0;
    fdb_file_handle *dbfile, *dbfile_less, *dbfile_non, *dbfile_manual, *dbfile_new;
    fdb_kvs_handle *db, *db_less, *db_non, *db_manual;
    fdb_kvs_handle *snapshot;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info info;
    fdb_status status;
    struct timeval ts_begin, ts_cur, ts_gap;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    fconfig.compaction_threshold = compaction_threshold;
    fconfig.compactor_sleep_duration = 1; // for quick test

    fconfig.num_compactor_threads = 0;
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig.num_compactor_threads = DEFAULT_NUM_COMPACTOR_THREADS;
    // open db
    fdb_open(&dbfile, "compact_test", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // insert documents
    printf("Initialize..\n");
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(metabuf, "meta%04d", i);
        sprintf(bodybuf, "body%04d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf)+1,
            (void*)metabuf, strlen(metabuf)+1, (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }
    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    // close db file
    fdb_close(dbfile);

    // ---- basic retrieve test ------------------------
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check db filename
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp(info.filename, "compact_test"));

    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // create a snapshot
    status = fdb_snapshot_open(db, &snapshot, n);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close snapshot
    fdb_kvs_close(snapshot);

    // close db file
    fdb_close(dbfile);

    // ---- handling when metafile is removed ------------
    // remove meta file
    r = system(SHELL_DEL" compact_test.meta > errorlog.txt");
    (void)r;
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }
    // close db file
    fdb_close(dbfile);

    // ---- handling when metafile points to non-exist file ------------
    // remove meta file
    r = system(SHELL_MOVE" compact_test.0 compact_test.23 > errorlog.txt");
    (void)r;
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }
    // close db file
    fdb_close(dbfile);

    // ---- compaction daemon test -------------------
    // db: DB instance to be compacted
    // db_less: DB instance to be compacted but with much lower update throughput
    // db_non: DB instance not to be compacted (auto compaction with threshold = 0)
    // db_manual: DB instance not to be compacted (manual compaction)

    // open & create db_less, db_non and db_manual
    status = fdb_open(&dbfile_less, "compact_test_less", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_less, &db_less, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fconfig.compaction_threshold = 0;
    status = fdb_open(&dbfile_non, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_non, &db_non, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_manual, "compact_test_manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_manual, &db_manual, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reopen db file
    fconfig.compaction_threshold = 30;
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // continuously update documents
    printf("wait for %d seconds..\n", (int)time_sec);
    gettimeofday(&ts_begin, NULL);
    while (!escape) {
        for (i=0;i<n;++i){
            // update db
            fdb_set(db, doc[i]);
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);

            // update db_less (1/100 throughput)
            if (i%100 == 0){
                fdb_set(db_less, doc[i]);
                fdb_commit(dbfile_less, FDB_COMMIT_NORMAL);
            }

            // update db_non
            fdb_set(db_non, doc[i]);
            fdb_commit(dbfile_non, FDB_COMMIT_NORMAL);

            // update db_manual
            fdb_set(db_manual, doc[i]);
            fdb_commit(dbfile_manual, FDB_COMMIT_NORMAL);

            gettimeofday(&ts_cur, NULL);
            ts_gap = _utime_gap(ts_begin, ts_cur);
            if ((size_t)ts_gap.tv_sec >= time_sec) {
                escape = 1;
                break;
            }
        }
    }

    // Change the compaction interval to 60 secs.
    status = fdb_set_daemon_compaction_interval(dbfile, 60);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Change the compaction interval back to 1 sec.
    status = fdb_set_daemon_compaction_interval(dbfile, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // perform manual compaction of auto-compact file
    status = fdb_compact(dbfile_non, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // perform manual compaction of manual-compact file
    status = fdb_compact(dbfile_manual, "compact_test_manual_compacted");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open compact_test_manual_compacted using new db handle
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_new, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // try to switch compaction mode
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 30);
    TEST_CHK(status == FDB_RESULT_FILE_IS_BUSY);

    // close db_new
    status = fdb_close(dbfile_new);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // switch compaction mode of 'db_manual' from MANUAL to AUTO
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 10);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // change compaction value
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 30);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close and open with auto-compact option
    status = fdb_close(dbfile_manual);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile_manual, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // switch compaction mode of 'db_non' from AUTO to MANUAL
    status = fdb_switch_compaction_mode(dbfile_non, FDB_COMPACTION_MANUAL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close and open with manual-compact option
    status = fdb_close(dbfile_non);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_non, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Now perform one manual compaction on compact_test_non
    fdb_compact(dbfile_non, "compact_test_non.manual");

    // close all db files except compact_test_non
    fdb_close(dbfile);
    fdb_close(dbfile_less);
    fdb_close(dbfile_manual);

    // open manual compact file (compact_test_non) using auto compact mode
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile, "compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // Attempt to destroy manual compact file using auto compact mode
    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // open auto copmact file (compact_test_manual_compacted) using manual compact mode
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // Attempt to destroy auto copmact file using manual compact mode
    status = fdb_destroy("compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // DESTROY auto copmact file with correct mode
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_destroy("compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // DESTROY manual compacted file with past version open!
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_FILE_IS_BUSY);
    fdb_close(dbfile_non);

    // Simulate a database crash by doing a premature shutdown
    // Note that db_non was never closed properly
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Attempt to read-only auto compacted and destroyed file
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    status = fdb_open(&dbfile, "./compact_test_manual_compacted.meta", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Attempt to read-only past version of manually compacted destroyed file
    status = fdb_open(&dbfile, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Attempt to read-only current version of manually compacted destroyed file
    status = fdb_open(&dbfile, "compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction daemon test");
}